

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O2

void mcbsp_get_tag(mcbsp_size_t *status,void *tag)

{
  size_t __n;
  pointer ppVar1;
  Bsmp *this;
  void *__src;
  TicToc t;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_get_tag: can only be called within SPMD section\n");
  }
  bsplib::TicToc::TicToc(&t,BSMP,s_bsmp->m_recv_tag_size);
  if (status == (mcbsp_size_t *)0x0) {
    bsp_abort("bsp_get_tag: first arguments may not be NULL\n");
  }
  __n = s_bsmp->m_recv_tag_size;
  if (__n != 0 && tag == (void *)0x0) {
    bsp_abort("bsp_get_tag: tag must point to a block of available memory of at least %zu bytes long\n"
              ,__n);
  }
  this = s_bsmp;
  ppVar1 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((s_bsmp->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar1) {
    *status = 0xffffffffffffffff;
  }
  else {
    *status = ppVar1[-1].second;
    __src = bsplib::Bsmp::tag(this);
    memcpy(tag,__src,__n);
  }
  bsplib::TicToc::~TicToc(&t);
  return;
}

Assistant:

void mcbsp_get_tag( mcbsp_size_t * status, void * tag )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_get_tag: can only be called within SPMD section\n");

#ifdef PROFILE
    TicToc t( TicToc::BSMP, s_bsmp->recv_tag_size() );
#endif

    if ( status == NULL )
        bsp_abort("bsp_get_tag: first arguments may not be NULL\n");

    size_t tag_size = s_bsmp->recv_tag_size();
    if ( tag == NULL && tag_size  > 0 )
        bsp_abort("bsp_get_tag: tag must point to a block of available "
                "memory of at least %zu bytes long\n", tag_size );

    if ( s_bsmp->empty() ) {
        *status = mcbsp_size_t(-1);
    }
    else {
        *status = s_bsmp->payload_size();
        std::memcpy( tag, s_bsmp->tag(), tag_size );
    }
}